

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

void __thiscall HighsHashTable<int,_void>::clear(HighsHashTable<int,_void> *this)

{
  uchar *puVar1;
  
  if (this->numElements != 0) {
    if (this->tableSizeMask != 0x7f) {
      makeEmptyTable(this,0x80);
      return;
    }
    puVar1 = (this->metadata)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    puVar1[0x70] = '\0';
    puVar1[0x71] = '\0';
    puVar1[0x72] = '\0';
    puVar1[0x73] = '\0';
    puVar1[0x74] = '\0';
    puVar1[0x75] = '\0';
    puVar1[0x76] = '\0';
    puVar1[0x77] = '\0';
    puVar1[0x78] = '\0';
    puVar1[0x79] = '\0';
    puVar1[0x7a] = '\0';
    puVar1[0x7b] = '\0';
    puVar1[0x7c] = '\0';
    puVar1[0x7d] = '\0';
    puVar1[0x7e] = '\0';
    puVar1[0x7f] = '\0';
    puVar1[0x60] = '\0';
    puVar1[0x61] = '\0';
    puVar1[0x62] = '\0';
    puVar1[99] = '\0';
    puVar1[100] = '\0';
    puVar1[0x65] = '\0';
    puVar1[0x66] = '\0';
    puVar1[0x67] = '\0';
    puVar1[0x68] = '\0';
    puVar1[0x69] = '\0';
    puVar1[0x6a] = '\0';
    puVar1[0x6b] = '\0';
    puVar1[0x6c] = '\0';
    puVar1[0x6d] = '\0';
    puVar1[0x6e] = '\0';
    puVar1[0x6f] = '\0';
    puVar1[0x50] = '\0';
    puVar1[0x51] = '\0';
    puVar1[0x52] = '\0';
    puVar1[0x53] = '\0';
    puVar1[0x54] = '\0';
    puVar1[0x55] = '\0';
    puVar1[0x56] = '\0';
    puVar1[0x57] = '\0';
    puVar1[0x58] = '\0';
    puVar1[0x59] = '\0';
    puVar1[0x5a] = '\0';
    puVar1[0x5b] = '\0';
    puVar1[0x5c] = '\0';
    puVar1[0x5d] = '\0';
    puVar1[0x5e] = '\0';
    puVar1[0x5f] = '\0';
    puVar1[0x40] = '\0';
    puVar1[0x41] = '\0';
    puVar1[0x42] = '\0';
    puVar1[0x43] = '\0';
    puVar1[0x44] = '\0';
    puVar1[0x45] = '\0';
    puVar1[0x46] = '\0';
    puVar1[0x47] = '\0';
    puVar1[0x48] = '\0';
    puVar1[0x49] = '\0';
    puVar1[0x4a] = '\0';
    puVar1[0x4b] = '\0';
    puVar1[0x4c] = '\0';
    puVar1[0x4d] = '\0';
    puVar1[0x4e] = '\0';
    puVar1[0x4f] = '\0';
    puVar1[0x30] = '\0';
    puVar1[0x31] = '\0';
    puVar1[0x32] = '\0';
    puVar1[0x33] = '\0';
    puVar1[0x34] = '\0';
    puVar1[0x35] = '\0';
    puVar1[0x36] = '\0';
    puVar1[0x37] = '\0';
    puVar1[0x38] = '\0';
    puVar1[0x39] = '\0';
    puVar1[0x3a] = '\0';
    puVar1[0x3b] = '\0';
    puVar1[0x3c] = '\0';
    puVar1[0x3d] = '\0';
    puVar1[0x3e] = '\0';
    puVar1[0x3f] = '\0';
    puVar1[0x20] = '\0';
    puVar1[0x21] = '\0';
    puVar1[0x22] = '\0';
    puVar1[0x23] = '\0';
    puVar1[0x24] = '\0';
    puVar1[0x25] = '\0';
    puVar1[0x26] = '\0';
    puVar1[0x27] = '\0';
    puVar1[0x28] = '\0';
    puVar1[0x29] = '\0';
    puVar1[0x2a] = '\0';
    puVar1[0x2b] = '\0';
    puVar1[0x2c] = '\0';
    puVar1[0x2d] = '\0';
    puVar1[0x2e] = '\0';
    puVar1[0x2f] = '\0';
    puVar1[0x10] = '\0';
    puVar1[0x11] = '\0';
    puVar1[0x12] = '\0';
    puVar1[0x13] = '\0';
    puVar1[0x14] = '\0';
    puVar1[0x15] = '\0';
    puVar1[0x16] = '\0';
    puVar1[0x17] = '\0';
    puVar1[0x18] = '\0';
    puVar1[0x19] = '\0';
    puVar1[0x1a] = '\0';
    puVar1[0x1b] = '\0';
    puVar1[0x1c] = '\0';
    puVar1[0x1d] = '\0';
    puVar1[0x1e] = '\0';
    puVar1[0x1f] = '\0';
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    this->numElements = 0;
  }
  return;
}

Assistant:

void clear() {
    if (numElements) {
      u64 capacity = tableSizeMask + 1;
      if (!std::is_trivially_destructible<Entry>::value) {
        for (u64 i = 0; i < capacity; ++i)
          if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
      if (capacity == 128) {
        std::memset(metadata.get(), 0, 128);
        numElements = 0;
      } else
        makeEmptyTable(128);
    }
  }